

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<kj::AutoCloseFd> __thiscall
kj::_::
TransformPromiseNode<kj::Promise<kj::AutoCloseFd>,_kj::Maybe<kj::AutoCloseFd>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1834:30),_kj::_::PropagateException>
::anon_class_1_0_00000001_for_func::operator()
          (anon_class_1_0_00000001_for_func *this,Maybe<kj::AutoCloseFd> *result)

{
  char *pcVar1;
  size_t sVar2;
  char (*in_RCX) [41];
  char *in_RDX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar3;
  Promise<kj::AutoCloseFd> PVar4;
  AutoCloseFd local_1b0;
  String local_1a8;
  undefined8 local_188;
  undefined8 uStack_180;
  Exception local_178;
  
  if (*in_RDX == '\x01') {
    local_1b0.fd = *(int *)(in_RDX + 4);
    UnwindDetector::UnwindDetector(&local_1b0.unwindDetector);
    in_RDX[4] = -1;
    in_RDX[5] = -1;
    in_RDX[6] = -1;
    in_RDX[7] = -1;
    heap<kj::_::ImmediatePromiseNode<kj::AutoCloseFd>,kj::AutoCloseFd>((kj *)&local_178,&local_1b0);
    *(char **)this = local_178.ownFile.content.ptr;
    *(size_t *)(this + 8) = local_178.ownFile.content.size_;
    AutoCloseFd::~AutoCloseFd(&local_1b0);
    pPVar3 = extraout_RDX;
  }
  else {
    Debug::makeDescription<char_const(&)[41]>
              (&local_1a8,(Debug *)"\"EOF when expecting to receive capability\"",
               "EOF when expecting to receive capability",in_RCX);
    Exception::Exception
              (&local_178,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x72e,&local_1a8);
    heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_188,&local_178);
    *(undefined8 *)this = local_188;
    *(undefined8 *)(this + 8) = uStack_180;
    Exception::~Exception(&local_178);
    sVar2 = local_1a8.content.size_;
    pcVar1 = local_1a8.content.ptr;
    pPVar3 = extraout_RDX_00;
    if (local_1a8.content.ptr != (char *)0x0) {
      local_1a8.content.ptr = (char *)0x0;
      local_1a8.content.size_ = 0;
      (**(local_1a8.content.disposer)->_vptr_ArrayDisposer)
                (local_1a8.content.disposer,pcVar1,1,sVar2,sVar2,0);
      pPVar3 = extraout_RDX_01;
    }
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::AutoCloseFd>)PVar4.super_PromiseBase.node;
}

Assistant:

Promise<AutoCloseFd> AsyncCapabilityStream::receiveFd() {
  return tryReceiveFd().then([](Maybe<AutoCloseFd>&& result) -> Promise<AutoCloseFd> {
    KJ_IF_MAYBE(r, result) {
      return kj::mv(*r);
    } else {
      return KJ_EXCEPTION(FAILED, "EOF when expecting to receive capability");
    }
  });
}